

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall
xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex::Vertex
          (Vertex *this,SimpleState *s,int64_t id)

{
  this->state = s;
  this->vertex_id = id;
  (this->edges_to).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->edges_to;
  (this->edges_to).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->edges_to;
  (this->edges_to).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>
  ._M_impl._M_node._M_size = 0;
  (this->vertices_from).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->vertices_from;
  (this->vertices_from).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->vertices_from;
  (this->vertices_from).
  super__List_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ._M_impl._M_node._M_size = 0;
  this->is_checked = false;
  this->is_in_openlist = false;
  this->f_cost = 1.79769313486232e+308;
  this->g_cost = 1.79769313486232e+308;
  this->h_cost = 1.79769313486232e+308;
  (this->search_parent).super_const_vertex_iterator.super_VertexMapTypeIterator.
  super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  ._M_cur = (__node_type *)0x0;
  return;
}

Assistant:

Vertex(State s, int64_t id) : state(s), vertex_id(id) {}